

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O1

bool __thiscall SuperCardPro::GetDriveStatus(SuperCardPro *this,int *status)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ushort *puVar5;
  uint16_t drv_status;
  int bytes_read;
  ushort local_2e;
  int local_2c;
  
  bVar1 = SendCmd(this,0x8e,(void *)0x0,0,(void *)0x0,0);
  if (bVar1) {
    local_2c = 0;
    puVar5 = &local_2e;
    iVar2 = (*this->_vptr_SuperCardPro[2])(this,puVar5,2);
    if ((char)iVar2 != '\0') {
      uVar3 = 2;
      do {
        uVar4 = uVar3 - local_2c;
        if (uVar4 == 0 || (int)uVar3 < local_2c) goto LAB_0017068e;
        puVar5 = (ushort *)((long)puVar5 + (long)local_2c);
        iVar2 = (*this->_vptr_SuperCardPro[2])(this,puVar5,(ulong)uVar4,&local_2c);
        uVar3 = uVar4;
      } while ((char)iVar2 != '\0');
      if ((int)uVar4 < 1) {
LAB_0017068e:
        *status = (uint)(ushort)(local_2e << 8 | local_2e >> 8);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SuperCardPro::GetDriveStatus(int& status)
{
    uint16_t drv_status;

    if (!SendCmd(CMD_STATUS))
        return false;

    if (!ReadExact(&drv_status, sizeof(drv_status)))
        return false;

    status = util::betoh(drv_status);

    return true;
}